

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

bool wasm::Properties::isNamedControlFlow(Expression *curr)

{
  Block *pBVar1;
  Loop *pLVar2;
  Try *pTVar3;
  Try *try_;
  Loop *loop;
  Block *block;
  Expression *curr_local;
  
  pBVar1 = Expression::dynCast<wasm::Block>(curr);
  if (pBVar1 == (Block *)0x0) {
    pLVar2 = Expression::dynCast<wasm::Loop>(curr);
    if (pLVar2 == (Loop *)0x0) {
      pTVar3 = Expression::dynCast<wasm::Try>(curr);
      if (pTVar3 == (Try *)0x0) {
        curr_local._7_1_ = false;
      }
      else {
        curr_local._7_1_ = IString::is((IString *)(pTVar3 + 0x10));
      }
    }
    else {
      curr_local._7_1_ = IString::is((IString *)(pLVar2 + 0x10));
    }
  }
  else {
    curr_local._7_1_ = IString::is(&(pBVar1->name).super_IString);
  }
  return curr_local._7_1_;
}

Assistant:

inline bool isNamedControlFlow(Expression* curr) {
  if (auto* block = curr->dynCast<Block>()) {
    return block->name.is();
  } else if (auto* loop = curr->dynCast<Loop>()) {
    return loop->name.is();
  } else if (auto* try_ = curr->dynCast<Try>()) {
    return try_->name.is();
  }
  return false;
}